

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O0

int __thiscall DIS::SeesPdu::getMarshalledSize(SeesPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  undefined1 local_58 [8];
  VectoringNozzleSystemData listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  PropulsionSystemData listElement;
  unsigned_long_long idx;
  int marshalSize;
  SeesPdu *this_local;
  
  iVar2 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_orginatingEntityID);
  idx._4_4_ = iVar2 + iVar3 + 10;
  listElement._powerSetting = 0.0;
  listElement._engineRpm = 0.0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar4 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::size
                      (&this->_propulsionSystemData);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::
             operator[](&this->_propulsionSystemData,listElement._8_8_);
    PropulsionSystemData::PropulsionSystemData((PropulsionSystemData *)local_30,pvVar5);
    iVar2 = PropulsionSystemData::getMarshalledSize((PropulsionSystemData *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    PropulsionSystemData::~PropulsionSystemData((PropulsionSystemData *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._horizontalDeflectionAngle = 0.0;
  listElement_1._verticalDeflectionAngle = 0.0;
  while( true ) {
    uVar1 = listElement_1._8_8_;
    sVar4 = std::
            vector<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
            ::size(&this->_vectoringSystemData);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar6 = std::
             vector<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
             ::operator[](&this->_vectoringSystemData,listElement_1._8_8_);
    VectoringNozzleSystemData::VectoringNozzleSystemData
              ((VectoringNozzleSystemData *)local_58,pvVar6);
    iVar2 = VectoringNozzleSystemData::getMarshalledSize((VectoringNozzleSystemData *)local_58);
    idx._4_4_ = idx._4_4_ + iVar2;
    VectoringNozzleSystemData::~VectoringNozzleSystemData((VectoringNozzleSystemData *)local_58);
    listElement_1._8_8_ = listElement_1._8_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int SeesPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _orginatingEntityID.getMarshalledSize();  // _orginatingEntityID
   marshalSize = marshalSize + 2;  // _infraredSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _acousticSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _radarCrossSectionSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _numberOfPropulsionSystems
   marshalSize = marshalSize + 2;  // _numberOfVectoringNozzleSystems

   for(unsigned long long idx=0; idx < _propulsionSystemData.size(); idx++)
   {
        PropulsionSystemData listElement = _propulsionSystemData[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _vectoringSystemData.size(); idx++)
   {
        VectoringNozzleSystemData listElement = _vectoringSystemData[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}